

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_specific.cc
# Opt level: O0

vector<int,_std::allocator<int>_> * highwayhash::AvailableCPUs(void)

{
  vector<int,_std::allocator<int>_> *in_RDI;
  uint local_64;
  value_type_conflict4 local_48;
  uint local_44;
  size_t local_40;
  size_t __cpu;
  size_t cpu;
  ThreadAffinity *affinity;
  undefined1 local_11;
  vector<int,_std::allocator<int>_> *cpus;
  
  local_11 = 0;
  std::vector<int,_std::allocator<int>_>::vector(in_RDI);
  std::vector<int,_std::allocator<int>_>::reserve(in_RDI,0x40);
  cpu = (size_t)anon_unknown_0::OriginalThreadAffinity();
  for (__cpu = 0; __cpu < 0x400; __cpu = __cpu + 1) {
    local_40 = __cpu;
    if (__cpu >> 3 < 0x80) {
      local_64 = (uint)((*(ulong *)(cpu + (__cpu >> 6) * 8) & 1L << ((byte)__cpu & 0x3f)) != 0);
    }
    else {
      local_64 = 0;
    }
    local_44 = local_64;
    if (local_64 != 0) {
      local_48 = (value_type_conflict4)__cpu;
      std::vector<int,_std::allocator<int>_>::push_back(in_RDI,&local_48);
    }
  }
  return in_RDI;
}

Assistant:

std::vector<int> AvailableCPUs() {
  std::vector<int> cpus;
  cpus.reserve(64);
  const ThreadAffinity* const affinity = OriginalThreadAffinity();
#if OS_WIN
  for (int cpu = 0; cpu < 64; ++cpu) {
    if (affinity->mask & (1ULL << cpu)) {
      cpus.push_back(cpu);
    }
  }
#elif OS_LINUX
  for (size_t cpu = 0; cpu < sizeof(cpu_set_t) * 8; ++cpu) {
    if (CPU_ISSET(cpu, &affinity->set)) {
      cpus.push_back(cpu);
    }
  }
#elif OS_FREEBSD
  for (size_t cpu = 0; cpu < sizeof(cpuset_t) * 8; ++cpu) {
    if (CPU_ISSET(cpu, &affinity->set)) {
      cpus.push_back(cpu);
    }
  }
#elif OS_MAC
  for (int cpu = 0; cpu < sizeof(cpu_set_t) * 8; ++cpu) {
    if (CPU_ISSET(cpu, &affinity->set)) {
      cpus.push_back(cpu);
    }
  }
#else
#error "port"
#endif
  return cpus;
}